

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::clear(Mat *this)

{
  allocator_type local_29;
  _Vector_base<__int128,_std::allocator<__int128>_> local_28;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)&local_28,(long)this->c * (long)this->r,
             &local_29);
  std::vector<__int128,_std::allocator<__int128>_>::_M_move_assign(&this->val,&local_28);
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void Mat::clear() {
    val = vector<ll128>(r * c);
}